

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O3

bool __thiscall cmCacheManager::SaveCache(cmCacheManager *this,string *path,cmMessenger *messenger)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CacheEntry *pCVar2;
  _Base_ptr *pp_Var3;
  CacheEntryType type;
  int iVar4;
  pointer pcVar5;
  char cVar6;
  char cVar7;
  uint uVar8;
  ostream *poVar9;
  string *psVar10;
  cmValue cVar11;
  cmCacheManager *pcVar12;
  cmCacheManager *pcVar13;
  uint uVar14;
  bool bVar15;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string currentcwd;
  string checkCacheFile;
  string cacheFile;
  ofstream checkCache;
  cmGeneratedFileStream fout;
  string local_538;
  cmMessenger *local_518;
  cmCacheManager *local_510;
  string local_508;
  string *local_4e8;
  cmCacheManager *local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  string local_4b8;
  undefined1 local_498 [8];
  pointer local_490;
  undefined1 local_488 [16];
  byte abStack_478 [216];
  ios_base local_3a0 [264];
  undefined1 local_298 [16];
  _Base_ptr local_288;
  char *local_280;
  byte abStack_278 [584];
  
  local_298._8_8_ = (path->_M_dataplus)._M_p;
  local_298._0_8_ = path->_M_string_length;
  local_288 = (_Base_ptr)0xf;
  local_280 = "/CMakeCache.txt";
  views._M_len = 2;
  views._M_array = (iterator)local_298;
  local_518 = messenger;
  cmCatViews_abi_cxx11_(&local_4b8,views);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_298,&local_4b8,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_298,true);
  if ((abStack_278[(long)*(_func_int **)(local_298._0_8_ + -0x18)] & 5) == 0) {
    local_498 = (undefined1  [8])local_488;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_498,"CMAKE_CACHE_MAJOR_VERSION","");
    uVar8 = cmVersion::GetMajorVersion();
    cVar7 = '\x01';
    if (9 < uVar8) {
      uVar14 = uVar8;
      cVar6 = '\x04';
      do {
        cVar7 = cVar6;
        if (uVar14 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_003b68cb;
        }
        if (uVar14 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_003b68cb;
        }
        if (uVar14 < 10000) goto LAB_003b68cb;
        bVar15 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        cVar6 = cVar7 + '\x04';
      } while (bVar15);
      cVar7 = cVar7 + '\x01';
    }
LAB_003b68cb:
    paVar1 = &local_538.field_2;
    local_538._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_538,cVar7);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_538._M_dataplus._M_p,(uint)local_538._M_string_length,uVar8);
    AddCacheEntry(this,(string *)local_498,&local_538,
                  "Major version of cmake used to create the current loaded cache",INTERNAL);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p != paVar1) {
      operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
    }
    if (local_498 != (undefined1  [8])local_488) {
      operator_delete((void *)local_498,local_488._0_8_ + 1);
    }
    local_498 = (undefined1  [8])local_488;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_498,"CMAKE_CACHE_MINOR_VERSION","");
    uVar8 = cmVersion::GetMinorVersion();
    cVar7 = '\x01';
    if (9 < uVar8) {
      uVar14 = uVar8;
      cVar6 = '\x04';
      do {
        cVar7 = cVar6;
        if (uVar14 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_003b69c7;
        }
        if (uVar14 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_003b69c7;
        }
        if (uVar14 < 10000) goto LAB_003b69c7;
        bVar15 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        cVar6 = cVar7 + '\x04';
      } while (bVar15);
      cVar7 = cVar7 + '\x01';
    }
LAB_003b69c7:
    local_538._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_538,cVar7);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_538._M_dataplus._M_p,(uint)local_538._M_string_length,uVar8);
    AddCacheEntry(this,(string *)local_498,&local_538,
                  "Minor version of cmake used to create the current loaded cache",INTERNAL);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p != paVar1) {
      operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
    }
    if (local_498 != (undefined1  [8])local_488) {
      operator_delete((void *)local_498,local_488._0_8_ + 1);
    }
    local_498 = (undefined1  [8])local_488;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_498,"CMAKE_CACHE_PATCH_VERSION","");
    uVar8 = cmVersion::GetPatchVersion();
    cVar7 = '\x01';
    if (9 < uVar8) {
      uVar14 = uVar8;
      cVar6 = '\x04';
      do {
        cVar7 = cVar6;
        if (uVar14 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_003b6abd;
        }
        if (uVar14 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_003b6abd;
        }
        if (uVar14 < 10000) goto LAB_003b6abd;
        bVar15 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        cVar6 = cVar7 + '\x04';
      } while (bVar15);
      cVar7 = cVar7 + '\x01';
    }
LAB_003b6abd:
    local_538._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_538,cVar7);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_538._M_dataplus._M_p,(uint)local_538._M_string_length,uVar8);
    AddCacheEntry(this,(string *)local_498,&local_538,
                  "Patch version of cmake used to create the current loaded cache",INTERNAL);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p != paVar1) {
      operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
    }
    if (local_498 != (undefined1  [8])local_488) {
      operator_delete((void *)local_498,local_488._0_8_ + 1);
    }
    pcVar5 = (path->_M_dataplus)._M_p;
    local_538._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_538,pcVar5,pcVar5 + path->_M_string_length);
    if (((byte)(*local_538._M_dataplus._M_p + 0xbfU) < 0x1a) &&
       (local_538._M_dataplus._M_p[1] == 0x3a)) {
      *local_538._M_dataplus._M_p = *local_538._M_dataplus._M_p | 0x20;
    }
    local_4e8 = path;
    cmsys::SystemTools::ConvertToUnixSlashes(&local_538);
    local_498 = (undefined1  [8])local_488;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"CMAKE_CACHEFILE_DIR","");
    AddCacheEntry(this,(string *)local_498,&local_538,
                  "This is the directory where this CMakeCache.txt was created",INTERNAL);
    if (local_498 != (undefined1  [8])local_488) {
      operator_delete((void *)local_498,local_488._0_8_ + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"# This is the CMakeCache file.\n# For build in directory: ",
               0x39);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_298,local_538._M_dataplus._M_p,
                        CONCAT44(local_538._M_string_length._4_4_,(uint)local_538._M_string_length))
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\n# It was generated by CMake: ",0x1e);
    psVar10 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,
               "\n# You can edit this file to change values found and used by cmake.\n# If you do not want to change any of the values, simply exit the editor.\n# If you do want to change a value, simply edit, save, and exit the editor.\n# The syntax for the file is as follows:\n# KEY:TYPE=VALUE\n# KEY is the name of a variable in the cache.\n# TYPE is a hint to GUIs for the type of VALUE, DO NOT EDIT TYPE!.\n# VALUE is the current value for the KEY.\n\n########################\n# EXTERNAL cache entries\n########################\n\n"
               ,0x1fc);
    pcVar12 = (cmCacheManager *)(this->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_510 = (cmCacheManager *)&(this->Cache)._M_t._M_impl.super__Rb_tree_header;
    local_4e0 = this;
    if (pcVar12 != local_510) {
      do {
        type = *(CacheEntryType *)
                &pcVar12[1].Cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        if ((type != INTERNAL &
            *(byte *)&pcVar12[2].Cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right) == 1)
        {
          local_498 = (undefined1  [8])local_488;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"HELPSTRING","");
          pCVar2 = (CacheEntry *)(pcVar12 + 1);
          cVar11 = CacheEntry::GetProperty(pCVar2,(string *)local_498);
          if (local_498 != (undefined1  [8])local_488) {
            operator_delete((void *)local_498,local_488._0_8_ + 1);
          }
          if (cVar11.Value == (string *)0x0) {
            local_498 = (undefined1  [8])local_488;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_498,"Missing description","");
            OutputHelpString((ostream *)local_298,(string *)local_498);
            if (local_498 != (undefined1  [8])local_488) {
              operator_delete((void *)local_498,local_488._0_8_ + 1);
            }
          }
          else {
            OutputHelpString((ostream *)local_298,cVar11.Value);
          }
          pp_Var3 = &(pcVar12->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          OutputKey((ostream *)local_298,(string *)pp_Var3);
          local_498[0] = (string)0x3a;
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_298,local_498,1);
          psVar10 = cmState::CacheEntryTypeToString_abi_cxx11_(type);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
          local_498[0] = (string)0x3d;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_498,1);
          OutputValue((ostream *)local_298,(string *)pCVar2);
          local_498[0] = (string)0xa;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,local_498,1);
          OutputNewlineTruncationWarning
                    ((ostream *)local_298,(string *)pp_Var3,(string *)pCVar2,local_518);
          local_498[0] = (string)0xa;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,local_498,1);
        }
        pcVar12 = (cmCacheManager *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar12);
      } while (pcVar12 != local_510);
    }
    pcVar12 = (cmCacheManager *)local_298;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pcVar12,
               "\n########################\n# INTERNAL cache entries\n########################\n\n",
               0x4d);
    pcVar13 = (cmCacheManager *)
              (local_4e0->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (pcVar13 != local_510) {
      do {
        if (*(char *)&pcVar13[2].Cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right ==
            '\x01') {
          pp_Var3 = &(pcVar13->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          pCVar2 = (CacheEntry *)(pcVar13 + 1);
          iVar4 = *(int *)&pcVar13[1].Cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          WritePropertyEntries(pcVar12,(ostream *)local_298,(string *)pp_Var3,pCVar2,local_518);
          if (iVar4 == 4) {
            local_498 = (undefined1  [8])local_488;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"HELPSTRING","");
            cVar11 = CacheEntry::GetProperty(pCVar2,(string *)local_498);
            if (local_498 != (undefined1  [8])local_488) {
              operator_delete((void *)local_498,local_488._0_8_ + 1);
            }
            if (cVar11.Value != (string *)0x0) {
              OutputHelpString((ostream *)local_298,cVar11.Value);
            }
            OutputKey((ostream *)local_298,(string *)pp_Var3);
            local_498[0] = (string)0x3a;
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_298,(char *)local_498,1);
            psVar10 = cmState::CacheEntryTypeToString_abi_cxx11_(INTERNAL);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
            local_498[0] = (string)0x3d;
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_498,1);
            OutputValue((ostream *)local_298,(string *)pCVar2);
            local_498[0] = (string)0xa;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_298,(char *)local_498,1);
            OutputNewlineTruncationWarning
                      ((ostream *)local_298,(string *)pp_Var3,(string *)pCVar2,local_518);
          }
        }
        pcVar12 = pcVar13;
        pcVar13 = (cmCacheManager *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar13);
      } while (pcVar13 != local_510);
    }
    local_498[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,local_498,1);
    cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_298);
    local_490 = (local_4e8->_M_dataplus)._M_p;
    local_498 = (undefined1  [8])local_4e8->_M_string_length;
    local_488._0_8_ = 0xb;
    local_488._8_8_ = "/CMakeFiles";
    views_00._M_len = 2;
    views_00._M_array = (iterator)local_498;
    cmCatViews_abi_cxx11_(&local_508,views_00);
    cmsys::SystemTools::MakeDirectory(&local_508,(mode_t *)0x0);
    std::__cxx11::string::append((char *)&local_508);
    std::ofstream::ofstream(local_498,local_508._M_dataplus._M_p,_S_out);
    bVar15 = (abStack_478[*(long *)((long)local_498 + -0x18)] & 5) == 0;
    if (bVar15) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_498,
                 "# This file is generated by cmake for dependency checking of the CMakeCache.txt file\n"
                 ,0x55);
    }
    else {
      std::operator+(&local_4d8,"Unable to open check cache file for write. ",&local_508);
      cmSystemTools::Error(&local_4d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
        operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
      }
    }
    local_498 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_498 + *(long *)(_VTT + -0x18)) = _EVP_PKEY_get_bn_param;
    std::filebuf::~filebuf((filebuf *)&local_490);
    std::ios_base::~ios_base(local_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p != &local_538.field_2) {
      operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498,
                   "Unable to open cache file for save. ",&local_4b8);
    cmSystemTools::Error((string *)local_498);
    if (local_498 != (undefined1  [8])local_488) {
      operator_delete((void *)local_498,local_488._0_8_ + 1);
    }
    cmSystemTools::ReportLastSystemError("");
    bVar15 = false;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  return bVar15;
}

Assistant:

bool cmCacheManager::SaveCache(const std::string& path, cmMessenger* messenger)
{
  std::string cacheFile = cmStrCat(path, "/CMakeCache.txt");
  cmGeneratedFileStream fout(cacheFile);
  fout.SetCopyIfDifferent(true);
  if (!fout) {
    cmSystemTools::Error("Unable to open cache file for save. " + cacheFile);
    cmSystemTools::ReportLastSystemError("");
    return false;
  }
  // before writing the cache, update the version numbers
  // to the
  this->AddCacheEntry("CMAKE_CACHE_MAJOR_VERSION",
                      std::to_string(cmVersion::GetMajorVersion()),
                      "Major version of cmake used to create the "
                      "current loaded cache",
                      cmStateEnums::INTERNAL);
  this->AddCacheEntry("CMAKE_CACHE_MINOR_VERSION",
                      std::to_string(cmVersion::GetMinorVersion()),
                      "Minor version of cmake used to create the "
                      "current loaded cache",
                      cmStateEnums::INTERNAL);
  this->AddCacheEntry("CMAKE_CACHE_PATCH_VERSION",
                      std::to_string(cmVersion::GetPatchVersion()),
                      "Patch version of cmake used to create the "
                      "current loaded cache",
                      cmStateEnums::INTERNAL);

  // Let us store the current working directory so that if somebody
  // Copies it, he will not be surprised
  std::string currentcwd = path;
  if (currentcwd[0] >= 'A' && currentcwd[0] <= 'Z' && currentcwd[1] == ':') {
    // Cast added to avoid compiler warning. Cast is ok because
    // value is guaranteed to fit in char by the above if...
    currentcwd[0] = static_cast<char>(currentcwd[0] - 'A' + 'a');
  }
  cmSystemTools::ConvertToUnixSlashes(currentcwd);
  this->AddCacheEntry("CMAKE_CACHEFILE_DIR", currentcwd,
                      "This is the directory where this CMakeCache.txt"
                      " was created",
                      cmStateEnums::INTERNAL);

  /* clang-format off */
  fout << "# This is the CMakeCache file.\n"
          "# For build in directory: " << currentcwd << "\n"
          "# It was generated by CMake: "
       << cmSystemTools::GetCMakeCommand()
       << "\n"
          "# You can edit this file to change values found and used by cmake."
          "\n"
          "# If you do not want to change any of the values, simply exit the "
          "editor.\n"
          "# If you do want to change a value, simply edit, save, and exit "
          "the editor.\n"
          "# The syntax for the file is as follows:\n"
          "# KEY:TYPE=VALUE\n"
          "# KEY is the name of a variable in the cache.\n"
          "# TYPE is a hint to GUIs for the type of VALUE, DO NOT EDIT TYPE!."
          "\n"
          "# VALUE is the current value for the KEY.\n"
          "\n"
          "########################\n"
          "# EXTERNAL cache entries\n"
          "########################\n"
          "\n";
  /* clang-format on */

  for (auto const& i : this->Cache) {
    CacheEntry const& ce = i.second;
    cmStateEnums::CacheEntryType t = ce.Type;
    if (!ce.Initialized) {
      /*
        // This should be added in, but is not for now.
      cmSystemTools::Error("Cache entry \"" + i.first + "\" is uninitialized");
      */
    } else if (t != cmStateEnums::INTERNAL) {
      // Format is key:type=value
      if (cmValue help = ce.GetProperty("HELPSTRING")) {
        cmCacheManager::OutputHelpString(fout, *help);
      } else {
        cmCacheManager::OutputHelpString(fout, "Missing description");
      }
      cmCacheManager::OutputKey(fout, i.first);
      fout << ':' << cmState::CacheEntryTypeToString(t) << '=';
      cmCacheManager::OutputValue(fout, ce.Value);
      fout << '\n';
      cmCacheManager::OutputNewlineTruncationWarning(fout, i.first, ce.Value,
                                                     messenger);
      fout << '\n';
    }
  }

  fout << "\n"
          "########################\n"
          "# INTERNAL cache entries\n"
          "########################\n"
          "\n";

  for (auto const& i : this->Cache) {
    if (!i.second.Initialized) {
      continue;
    }

    cmStateEnums::CacheEntryType t = i.second.GetType();
    this->WritePropertyEntries(fout, i.first, i.second, messenger);
    if (t == cmStateEnums::INTERNAL) {
      // Format is key:type=value
      if (cmValue help = i.second.GetProperty("HELPSTRING")) {
        cmCacheManager::OutputHelpString(fout, *help);
      }
      cmCacheManager::OutputKey(fout, i.first);
      fout << ':' << cmState::CacheEntryTypeToString(t) << '=';
      cmCacheManager::OutputValue(fout, i.second.GetValue());
      fout << '\n';
      cmCacheManager::OutputNewlineTruncationWarning(
        fout, i.first, i.second.GetValue(), messenger);
    }
  }
  fout << '\n';
  fout.Close();
  std::string checkCacheFile = cmStrCat(path, "/CMakeFiles");
  cmSystemTools::MakeDirectory(checkCacheFile);
  checkCacheFile += "/cmake.check_cache";
  cmsys::ofstream checkCache(checkCacheFile.c_str());
  if (!checkCache) {
    cmSystemTools::Error("Unable to open check cache file for write. " +
                         checkCacheFile);
    return false;
  }
  checkCache << "# This file is generated by cmake for dependency checking "
                "of the CMakeCache.txt file\n";
  return true;
}